

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolver_sync.c
# Opt level: O1

DNSRESOLVER_HANDLE dns_resolver_create(char *hostname,int port,DNSRESOLVER_OPTIONS *options)

{
  int iVar1;
  char **destination;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  
  if (hostname == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar3 = "NULL hostname";
      iVar1 = 0x32;
LAB_0016fb17:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/dns_resolver_sync.c"
                ,"dns_resolver_create",iVar1,1,pcVar3);
      return (DNSRESOLVER_HANDLE)0x0;
    }
  }
  else {
    destination = (char **)calloc(1,0x20);
    if (destination == (char **)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar3 = "malloc instance failed";
        iVar1 = 0x3b;
        goto LAB_0016fb17;
      }
    }
    else {
      *(undefined2 *)(destination + 2) = 0;
      *(int *)(destination + 1) = port;
      iVar1 = mallocAndStrcpy_s(destination,hostname);
      if (iVar1 == 0) {
        return destination;
      }
      free(destination);
    }
  }
  return (DNSRESOLVER_HANDLE)0x0;
}

Assistant:

DNSRESOLVER_HANDLE dns_resolver_create(const char* hostname, int port, const DNSRESOLVER_OPTIONS* options)
{
    /* Codes_SRS_dns_resolver_30_012: [ The optional options parameter shall be ignored. ]*/
    DNSRESOLVER_INSTANCE* result;
    (void)options;
    if (hostname == NULL)
    {
        /* Codes_SRS_dns_resolver_30_011: [ If the hostname parameter is NULL, dns_resolver_create shall log an error and return NULL. ]*/
        LogError("NULL hostname");
        result = NULL;
    }
    else
    {
        result = calloc(1, sizeof(DNSRESOLVER_INSTANCE));
        if (result == NULL)
        {
            /* Codes_SRS_dns_resolver_30_014: [ On any failure, dns_resolver_create shall log an error and return NULL. ]*/
            LogError("malloc instance failed");
            result = NULL;
        }
        else
        {
            int ms_result;
            result->is_complete = false;
            result->is_failed = false;
            result->port = port;
            /* Codes_SRS_dns_resolver_30_010: [ dns_resolver_create shall make a copy of the hostname parameter to allow immediate deletion by the caller. ]*/
            ms_result = mallocAndStrcpy_s(&result->hostname, hostname);
            if (ms_result != 0)
            {
                /* Codes_SRS_dns_resolver_30_014: [ On any failure, dns_resolver_create shall log an error and return NULL. ]*/
                free(result);
                result = NULL;
            }
        }
    }
    return result;
}